

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SxyTCA(TT_ExecContext exc)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  FT_Byte opcode;
  FT_Short BB;
  FT_Short AA;
  TT_ExecContext exc_local;
  
  bVar1 = exc->opcode;
  uVar2 = (bVar1 & 1) << 0xe;
  uVar3 = uVar2 ^ 0x4000;
  if (bVar1 < 4) {
    (exc->GS).projVector.x = uVar2;
    (exc->GS).projVector.y = uVar3;
    (exc->GS).dualVector.x = uVar2;
    (exc->GS).dualVector.y = uVar3;
  }
  if ((bVar1 & 2) == 0) {
    (exc->GS).freeVector.x = uVar2;
    (exc->GS).freeVector.y = uVar3;
  }
  Compute_Funcs(exc);
  return;
}

Assistant:

static void
  Ins_SxyTCA( TT_ExecContext  exc )
  {
    FT_Short  AA, BB;

    FT_Byte  opcode = exc->opcode;


    AA = (FT_Short)( ( opcode & 1 ) << 14 );
    BB = (FT_Short)( AA ^ 0x4000 );

    if ( opcode < 4 )
    {
      exc->GS.projVector.x = AA;
      exc->GS.projVector.y = BB;

      exc->GS.dualVector.x = AA;
      exc->GS.dualVector.y = BB;
    }

    if ( ( opcode & 2 ) == 0 )
    {
      exc->GS.freeVector.x = AA;
      exc->GS.freeVector.y = BB;
    }

    Compute_Funcs( exc );
  }